

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>::BitpackingAnalyzeState
          (BitpackingAnalyzeState<duckdb::hugeint_t> *this,CompressionInfo *info)

{
  hugeint_t local_28;
  
  (this->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__AnalyzeState_019a4e00;
  (this->super_AnalyzeState).info.block_manager = info->block_manager;
  (this->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__AnalyzeState_019a63b8;
  (this->state).compression_buffer_idx = 0;
  (this->state).total_size = 0;
  (this->state).data_ptr = (void *)0x0;
  (this->state).mode = AUTO;
  hugeint_t::hugeint_t(&local_28,0);
  (this->state).compression_buffer_internal[0].lower = local_28.lower;
  (this->state).compression_buffer_internal[0].upper = local_28.upper;
  (this->state).compression_buffer = (this->state).compression_buffer_internal + 1;
  BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Reset(&this->state);
  return;
}

Assistant:

explicit BitpackingAnalyzeState(const CompressionInfo &info) : AnalyzeState(info) {}